

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

bool __thiscall ON_SubDMeshFragment::SetColors(ON_SubDMeshFragment *this,ON_Color color)

{
  byte *pbVar1;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar2;
  size_t sVar3;
  ON_Color OVar4;
  uint uVar5;
  uint uVar6;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar7;
  long lVar8;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_24;
  
  local_24 = color.field_0;
  uVar5 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
  uVar6 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_24);
  if (uVar5 == uVar6) {
    pbVar1 = (byte *)((long)&this->m_vertex_capacity_etc + 1);
    *pbVar1 = *pbVar1 & 0xdf;
    OVar4 = ON_Color::UnsetColor;
    this->m_ctrlnetC[0].field_0 = ON_Color::UnsetColor.field_0;
    this->m_ctrlnetC[1].field_0 = OVar4.field_0;
    this->m_ctrlnetC[2].field_0 = OVar4.field_0;
    this->m_ctrlnetC[3].field_0 = OVar4.field_0;
  }
  else {
    this->m_ctrlnetC[0].field_0 = local_24;
    this->m_ctrlnetC[1].field_0 = local_24;
    this->m_ctrlnetC[2].field_0 = local_24;
    this->m_ctrlnetC[3].field_0 = local_24;
    paVar7 = &this->m_C->field_0;
    if ((((paVar7 != (anon_union_4_2_6147a14e_for_ON_Color_15 *)0x0) &&
         (sVar3 = this->m_C_stride, sVar3 != 0)) &&
        (uVar5 = this->m_vertex_capacity_etc & 0x1fff, (short)uVar5 != 0)) &&
       (lVar8 = uVar5 * sVar3, 0 < lVar8)) {
      paVar2 = paVar7 + lVar8;
      do {
        *paVar7 = local_24;
        paVar7 = paVar7 + sVar3;
      } while (paVar7 < paVar2);
    }
    pbVar1 = (byte *)((long)&this->m_vertex_capacity_etc + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return (bool)((*(byte *)((long)&this->m_vertex_capacity_etc + 1) & 0x20) >> 5);
}

Assistant:

bool ON_SubDMeshFragment::SetColors(ON_Color color) const
{
  if (ON_Color::UnsetColor == color)
  {
    ClearColors();
  }
  else
  {
    m_ctrlnetC[0] = color;
    m_ctrlnetC[1] = color;
    m_ctrlnetC[2] = color;
    m_ctrlnetC[3] = color;

    const size_t capacity = ColorCapacity();
    if (capacity > 0)
    {
      const size_t stride = m_C_stride;
      ON_Color* c = m_C;
      ON_Color* c1 = c + capacity * stride;
      while (c < c1)
      {
        *c = color;
        c += stride;
      }
    }
    this->SetColorsExistForExperts(true);
  }
  return ColorsExistForExperts();
}